

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountingStorageItemRegister.hpp
# Opt level: O0

int __thiscall
supermap::
CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
::clone(CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  *this_00;
  pointer pSVar1;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  *this_01;
  undefined1 local_20 [16];
  __fn *local_10;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  *local_8;
  
  this_01 = this;
  local_10 = __fn;
  local_8 = this;
  this_00 = (CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
             *)operator_new(0x18);
  pSVar1 = std::
           unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
           ::operator->((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
                         *)0x17a17d);
  (**(pSVar1->
     super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>
     )._vptr_Cloneable)(local_20);
  CountingStorageItemRegister
            (this_00,(uint)((ulong)__fn >> 0x20),
             (unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
              *)this_01);
  std::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>,std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>>>
  ::
  unique_ptr<std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>>,void>
            ((unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>_>_>
              *)this_01,this);
  std::
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,supermap::CountingStorageInfo<unsigned_int,void>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,supermap::CountingStorageInfo<unsigned_int,void>>>>
  ::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>,std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>>,void>
            ((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>_>
              *)this_00,
             (unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>_>_>
              *)__fn);
  std::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>_>_>
  ::~unique_ptr((unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>_>_>
                 *)this_01);
  std::
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
  ::~unique_ptr((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>
                 *)this_01);
  return (int)this_01;
}

Assistant:

std::unique_ptr<StorageItemRegister<T, CountingStorageInfo<IndexT, AdditionalInfo>>>
    clone() const override {
        return std::unique_ptr<CountingStorageItemRegister<T, IndexT, AdditionalInfo>>(
            new CountingStorageItemRegister(count_,
                                            innerRegister_->clone())
        );
    }